

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlBitMapBeRev(Vm *this,Instr *instr)

{
  unsigned_long val;
  
  val = _readFlInt<unsigned_long,_yactfr::internal::(anonymous_namespace)::readFlUIntBeFuncs,_true>
                  (this,instr);
  _setBitArrayElemBase<unsigned_long,yactfr::FixedLengthBitMapElement>
            (this,val,instr,&(this->_pos).elems.flBitMap);
  _consumeExistingBits(this,(ulong)*(uint *)((long)&instr[2]._vptr_Instr + 4));
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlBitMapBeRev(const Instr& instr)
{
    this->_execReadFlBitMap<readFlUIntBeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}